

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O3

_Bool hex_decode(char *str,size_t slen,void *buf,size_t bufsize)

{
  char cVar1;
  size_t sVar2;
  uchar *p;
  byte bVar3;
  byte bVar4;
  
  if (1 < slen) {
    sVar2 = 0;
    do {
      cVar1 = str[sVar2 * 2];
      bVar3 = cVar1 - 0x30;
      if (9 < bVar3) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar3 = cVar1 + 0xa9;
        }
        else {
          if (5 < (byte)(cVar1 + 0xbfU)) {
            return false;
          }
          bVar3 = cVar1 - 0x37;
        }
      }
      cVar1 = str[sVar2 * 2 + 1];
      bVar4 = cVar1 - 0x30;
      if (9 < bVar4) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar4 = cVar1 + 0xa9;
        }
        else {
          if (5 < (byte)(cVar1 + 0xbfU)) {
            return false;
          }
          bVar4 = cVar1 - 0x37;
        }
      }
      if (bufsize == sVar2) {
        return false;
      }
      *(byte *)((long)buf + sVar2) = bVar4 | bVar3 << 4;
      slen = slen - 2;
      sVar2 = sVar2 + 1;
    } while (1 < slen);
    bufsize = bufsize - sVar2;
  }
  return slen == 0 && bufsize == 0;
}

Assistant:

bool hex_decode(const char *str, size_t slen, void *buf, size_t bufsize)
{
	unsigned char v1, v2;
	unsigned char *p = buf;

	while (slen > 1) {
		if (!char_to_hex(&v1, str[0]) || !char_to_hex(&v2, str[1]))
			return false;
		if (!bufsize)
			return false;
		*(p++) = (v1 << 4) | v2;
		str += 2;
		slen -= 2;
		bufsize--;
	}
	return slen == 0 && bufsize == 0;
}